

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# losertree.h
# Opt level: O0

void __thiscall
loser_tree<int>::
loser_tree<__gnu_cxx::__normal_iterator<std::pair<int*,unsigned_long>*,std::vector<std::pair<int*,unsigned_long>,std::allocator<std::pair<int*,unsigned_long>>>>>
          (loser_tree<int> *this,
          __normal_iterator<std::pair<int_*,_unsigned_long>_*,_std::vector<std::pair<int_*,_unsigned_long>,_std::allocator<std::pair<int_*,_unsigned_long>_>_>_>
          begin,__normal_iterator<std::pair<int_*,_unsigned_long>_*,_std::vector<std::pair<int_*,_unsigned_long>,_std::allocator<std::pair<int_*,_unsigned_long>_>_>_>
                end)

{
  char extraout_AL;
  uint uVar1;
  difference_type dVar2;
  uint *puVar3;
  reference ppVar4;
  double __x;
  uint local_2c;
  uint i;
  void *raw;
  loser_tree<int> *this_local;
  __normal_iterator<std::pair<int_*,_unsigned_long>_*,_std::vector<std::pair<int_*,_unsigned_long>,_std::allocator<std::pair<int_*,_unsigned_long>_>_>_>
  end_local;
  __normal_iterator<std::pair<int_*,_unsigned_long>_*,_std::vector<std::pair<int_*,_unsigned_long>,_std::allocator<std::pair<int_*,_unsigned_long>_>_>_>
  begin_local;
  
  this->_nodes = (uint *)0x0;
  this->_streams = (Stream *)0x0;
  this_local = (loser_tree<int> *)end._M_current;
  end_local = begin;
  dVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<std::pair<int_*,_unsigned_long>_*,_std::vector<std::pair<int_*,_unsigned_long>,_std::allocator<std::pair<int_*,_unsigned_long>_>_>_>
                      *)&this_local,&end_local);
  this->_nonempty_streams = (uint)dVar2;
  log2(__x);
  this->_stream_offset = 1 << (extraout_AL + 1U & 0x1f);
  if (1 < this->_nonempty_streams) {
    puVar3 = (uint *)malloc((ulong)this->_stream_offset * 4 + (ulong)this->_stream_offset * 0x10);
    this->_nodes = puVar3;
    this->_streams = (Stream *)(puVar3 + this->_stream_offset);
    for (local_2c = 0; local_2c < this->_nonempty_streams; local_2c = local_2c + 1) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<std::pair<int_*,_unsigned_long>_*,_std::vector<std::pair<int_*,_unsigned_long>,_std::allocator<std::pair<int_*,_unsigned_long>_>_>_>
               ::operator[](&end_local,(ulong)local_2c);
      this->_streams[local_2c].stream = ppVar4->first;
      ppVar4 = __gnu_cxx::
               __normal_iterator<std::pair<int_*,_unsigned_long>_*,_std::vector<std::pair<int_*,_unsigned_long>,_std::allocator<std::pair<int_*,_unsigned_long>_>_>_>
               ::operator[](&end_local,(ulong)local_2c);
      this->_streams[local_2c].n = ppVar4->second;
    }
    memset(this->_streams + this->_nonempty_streams,0,
           (ulong)(this->_stream_offset - this->_nonempty_streams) << 4);
    uVar1 = init_min(this,1);
    *this->_nodes = uVar1;
    return;
  }
  __assert_fail("_nonempty_streams>1",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/unit-test/../src/losertree.h"
                ,0x53,
                "loser_tree<int>::loser_tree(Iterator, Iterator) [T = int, Iterator = __gnu_cxx::__normal_iterator<std::pair<int *, unsigned long> *, std::vector<std::pair<int *, unsigned long>>>]"
               );
}

Assistant:

loser_tree(Iterator begin, Iterator end)
		: _nodes(0), _streams(0), _nonempty_streams(end-begin),
		  _stream_offset(1 << (log2(_nonempty_streams-1)+1))
	{
		assert(_nonempty_streams>1);
		void* raw = malloc(_stream_offset*sizeof(unsigned) +
		                   _stream_offset*sizeof(Stream));
		_nodes = static_cast<unsigned*>(raw);
		_streams = reinterpret_cast<Stream*>(
				static_cast<char*>(raw) +
					_stream_offset*sizeof(unsigned));
		for (unsigned i=0; i < _nonempty_streams; ++i) {
			_streams[i].stream = begin[i].first;
			_streams[i].n      = begin[i].second;
		}
		(void) memset(_streams+_nonempty_streams, 0,
			(_stream_offset-_nonempty_streams)*sizeof(Stream));
		_nodes[0] = init_min(1);
		//debug()<<*this;
	}